

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O2

void __thiscall chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChNameValue<char> *bVal)

{
  indent(this);
  chrono::ChStreamOutAscii::operator<<(this->ostream,*(char **)bVal);
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\t");
  chrono::ChStreamOutAscii::operator<<(this->ostream,**(char **)(bVal + 8));
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\n");
  return;
}

Assistant:

virtual void out     (ChNameValue<char> bVal){
            indent();
            (*ostream) << bVal.name();
            (*ostream) << "\t";
            (*ostream) << bVal.value();
            (*ostream) << "\n";
      }